

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Field.cpp
# Opt level: O3

ostream * psy::C::operator<<(ostream *os,FieldDeclarationSymbol *fld)

{
  Lexeme *this;
  Type *ty;
  long lVar1;
  char *pcVar2;
  string local_38;
  
  if (fld == (FieldDeclarationSymbol *)0x0) {
    pcVar2 = "<Field is null>";
    lVar1 = 0xf;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<Field |",8);
    std::__ostream_insert<char,std::char_traits<char>>(os," name:",6);
    this = &MemberDeclarationSymbol::name(&fld->super_MemberDeclarationSymbol)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_38,this);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," type:",6);
    ty = MemberDeclarationSymbol::type(&fld->super_MemberDeclarationSymbol);
    operator<<(os,ty);
    pcVar2 = ">";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FieldDeclarationSymbol* fld)
{
    if (!fld)
        return os << "<Field is null>";
    os << "<Field |";
    os << " name:" << fld->name()->valueText();
    os << " type:" << fld->type();
    os << ">";
    return os;
}